

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BufferMapExplicitFlushCase::BufferMapExplicitFlushCase
          (BufferMapExplicitFlushCase *this,Context *context,char *name,char *desc,
          deUint32 bufferTarget,deUint32 usage,bool partialWrite,VerifyType verify)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  bool partialWrite_local;
  deUint32 usage_local;
  deUint32 bufferTarget_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  BufferMapExplicitFlushCase *this_local;
  
  testCtx = gles3::Context::getTestContext(context);
  renderCtx = gles3::Context::getRenderContext(context);
  deqp::gls::BufferTestUtil::BufferCase::BufferCase
            (&this->super_BufferCase,testCtx,renderCtx,name,desc);
  (this->super_BufferCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BufferMapExplicitFlushCase_032b10a8;
  this->m_bufferTarget = bufferTarget;
  this->m_usage = usage;
  this->m_partialWrite = partialWrite;
  this->m_verify = verify;
  return;
}

Assistant:

BufferMapExplicitFlushCase (Context& context, const char* name, const char* desc, deUint32 bufferTarget, deUint32 usage, bool partialWrite, VerifyType verify)
		: BufferCase		(context.getTestContext(), context.getRenderContext(), name, desc)
		, m_bufferTarget	(bufferTarget)
		, m_usage			(usage)
		, m_partialWrite	(partialWrite)
		, m_verify			(verify)
	{
	}